

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__write(uv_stream_t *stream)

{
  uint *puVar1;
  undefined1 *puVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong unaff_R12;
  iovec *__iovec;
  msghdr msg;
  anon_union_64_2_d657c519 scratch;
  msghdr local_b0;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  do {
    if ((stream->io_watcher).fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x32d,"void uv__write(uv_stream_t *)");
    }
    puVar2 = (undefined1 *)stream->write_queue[0];
    if (stream->write_queue == (void **)puVar2) {
      return;
    }
    if (*(uv_stream_t **)(puVar2 + -8) != stream) {
      __assert_fail("req->handle == stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x334,"void uv__write(uv_stream_t *)");
    }
    iVar11 = *(int *)(puVar2 + 0x20) - *(uint *)(puVar2 + 0x10);
    __iovec = (iovec *)((ulong)*(uint *)(puVar2 + 0x10) * 0x10 + *(long *)(puVar2 + 0x18));
    iVar5 = uv__getiovmax();
    if (iVar5 <= iVar11) {
      iVar11 = iVar5;
    }
    if (*(long *)(puVar2 + -0x10) == 0) {
      do {
        iVar5 = (stream->io_watcher).fd;
        if (iVar11 == 1) {
          unaff_R12 = write(iVar5,__iovec->iov_base,__iovec->iov_len);
        }
        else {
          unaff_R12 = writev(iVar5,__iovec,iVar11);
        }
        if (unaff_R12 != 0xffffffffffffffff) goto LAB_00548990;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      unaff_R12 = 0xffffffffffffffff;
    }
    else {
      lVar3 = *(long *)(puVar2 + -0x10);
      iVar5 = 3;
      if ((*(byte *)(lVar3 + 0x58) & 3) == 0) {
        iVar5 = *(int *)(lVar3 + 0x10);
        lVar8 = 0xb8;
        if ((iVar5 == 7) || (iVar5 == 0xc)) {
LAB_005488a3:
          uVar7 = *(uint *)(lVar3 + lVar8);
        }
        else {
          uVar7 = 0xffffffff;
          if (iVar5 == 0xf) {
            lVar8 = 0xb0;
            goto LAB_005488a3;
          }
        }
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        if ((int)uVar7 < 0) {
          __assert_fail("fd_to_send >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x35b,"void uv__write(uv_stream_t *)");
        }
        local_b0.msg_name = (void *)0x0;
        local_b0.msg_namelen = 0;
        local_b0.msg_iovlen = (size_t)iVar11;
        local_b0.msg_flags = 0;
        local_b0.msg_control = &local_78;
        local_b0.msg_controllen = 0x18;
        uStack_70 = 0x100000001;
        local_78 = 0x14;
        local_68 = (ulong)uVar7;
        local_b0.msg_iov = __iovec;
        do {
          unaff_R12 = sendmsg((stream->io_watcher).fd,&local_b0,0);
          if (unaff_R12 != 0xffffffffffffffff) break;
          piVar6 = __errno_location();
        } while (*piVar6 == 4);
        iVar5 = 0;
        if (-1 < (long)unaff_R12) {
          *(undefined8 *)(puVar2 + -0x10) = 0;
        }
      }
      if (iVar5 != 0) {
        if (iVar5 != 3) {
          return;
        }
        iVar11 = -9;
        goto LAB_00548a55;
      }
    }
LAB_00548990:
    if (unaff_R12 == 0xffffffffffffffff) {
      piVar6 = __errno_location();
      iVar11 = *piVar6;
      if ((iVar11 != 0xb) && (iVar11 != 0x69)) {
        iVar11 = -iVar11;
LAB_00548a55:
        *(int *)(puVar2 + 0x24) = iVar11;
        uv__write_req_finish((uv_write_t *)(puVar2 + -0x58));
        uv__io_stop(stream->loop,&stream->io_watcher,4);
        iVar11 = uv__io_active(&stream->io_watcher,1);
        if (iVar11 != 0) {
          return;
        }
        uVar7 = stream->flags;
        if ((uVar7 & 4) == 0) {
          return;
        }
        stream->flags = uVar7 & 0xfffffffb;
        if ((uVar7 & 8) == 0) {
          return;
        }
        puVar1 = &stream->loop->active_handles;
        *puVar1 = *puVar1 - 1;
        return;
      }
    }
    if (-1 < (long)unaff_R12) {
      if (stream->write_queue_size < unaff_R12) {
        __assert_fail("n <= stream->write_queue_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x2e7,"int uv__write_req_update(uv_stream_t *, uv_write_t *, size_t)");
      }
      stream->write_queue_size = stream->write_queue_size - unaff_R12;
      lVar3 = *(long *)(puVar2 + 0x18);
      plVar9 = (long *)((ulong)*(uint *)(puVar2 + 0x10) * 0x10 + lVar3);
      uVar10 = unaff_R12;
      do {
        uVar4 = plVar9[1];
        uVar12 = uVar4;
        if (uVar10 < uVar4) {
          uVar12 = uVar10;
        }
        *plVar9 = *plVar9 + uVar12;
        plVar9[1] = uVar4 - uVar12;
        plVar9 = plVar9 + (ulong)(uVar4 <= uVar10) * 2;
        uVar10 = uVar10 - uVar12;
      } while (uVar10 != 0);
      iVar11 = (int)((ulong)((long)plVar9 - lVar3) >> 4);
      *(int *)(puVar2 + 0x10) = iVar11;
      if (*(int *)(puVar2 + 0x20) == iVar11) {
        uv__write_req_finish((uv_write_t *)(puVar2 + -0x58));
        return;
      }
    }
    if ((stream->flags & 0x100000) == 0) {
      uv__io_start(stream->loop,&stream->io_watcher,4);
      return;
    }
  } while( true );
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct iovec* iov;
  QUEUE* q;
  uv_write_t* req;
  int iovmax;
  int iovcnt;
  ssize_t n;
  int err;

start:

  assert(uv__stream_fd(stream) >= 0);

  if (QUEUE_EMPTY(&stream->write_queue))
    return;

  q = QUEUE_HEAD(&stream->write_queue);
  req = QUEUE_DATA(q, uv_write_t, queue);
  assert(req->handle == stream);

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  assert(sizeof(uv_buf_t) == sizeof(struct iovec));
  iov = (struct iovec*) &(req->bufs[req->write_index]);
  iovcnt = req->nbufs - req->write_index;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */

  if (req->send_handle) {
    int fd_to_send;
    struct msghdr msg;
    struct cmsghdr *cmsg;
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    if (uv__is_closing(req->send_handle)) {
      err = UV_EBADF;
      goto error;
    }

    fd_to_send = uv__handle_fd((uv_handle_t*) req->send_handle);

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));

    /* Ensure the handle isn't sent again in case this is a partial write. */
    if (n >= 0)
      req->send_handle = NULL;
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  }

  if (n == -1 && !IS_TRANSIENT_WRITE_ERROR(errno, req->send_handle)) {
    err = UV__ERR(errno);
    goto error;
  }

  if (n >= 0 && uv__write_req_update(stream, req, n)) {
    uv__write_req_finish(req);
    return;  /* TODO(bnoordhuis) Start trying to write the next request. */
  }

  /* If this is a blocking stream, try again. */
  if (stream->flags & UV_HANDLE_BLOCKING_WRITES)
    goto start;

  /* We're not done. */
  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

  /* Notify select() thread about state change */
  uv__stream_osx_interrupt_select(stream);

  return;

error:
  req->error = err;
  uv__write_req_finish(req);
  uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  if (!uv__io_active(&stream->io_watcher, POLLIN))
    uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);
}